

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

void lzss_emit_match(rar *rar,int offset,int length)

{
  uint uVar1;
  int iVar2;
  uchar *__dest;
  uchar *__src;
  uchar *s;
  uchar *d;
  int local_28;
  int remaining;
  int li;
  int l;
  int srcoffs;
  int dstoffs;
  int length_local;
  int offset_local;
  rar *rar_local;
  
  l = lzss_current_offset(&rar->lzss);
  uVar1 = lzss_mask(&rar->lzss);
  li = l - offset & uVar1;
  d._4_4_ = length;
  while (0 < d._4_4_) {
    remaining = d._4_4_;
    if (li < l) {
      iVar2 = lzss_size(&rar->lzss);
      if (iVar2 - l < d._4_4_) {
        iVar2 = lzss_size(&rar->lzss);
        remaining = iVar2 - l;
      }
    }
    else {
      iVar2 = lzss_size(&rar->lzss);
      if (iVar2 - li < d._4_4_) {
        iVar2 = lzss_size(&rar->lzss);
        remaining = iVar2 - li;
      }
    }
    __dest = (rar->lzss).window + l;
    __src = (rar->lzss).window + li;
    if ((l + remaining < li) || (li + remaining < l)) {
      memcpy(__dest,__src,(long)remaining);
    }
    else {
      for (local_28 = 0; local_28 < remaining; local_28 = local_28 + 1) {
        __dest[local_28] = __src[local_28];
      }
    }
    d._4_4_ = d._4_4_ - remaining;
    uVar1 = lzss_mask(&rar->lzss);
    l = l + remaining & uVar1;
    uVar1 = lzss_mask(&rar->lzss);
    li = li + remaining & uVar1;
  }
  (rar->lzss).position = (long)length + (rar->lzss).position;
  return;
}

Assistant:

static inline void
lzss_emit_match(struct rar *rar, int offset, int length)
{
  int dstoffs = lzss_current_offset(&rar->lzss);
  int srcoffs = (dstoffs - offset) & lzss_mask(&rar->lzss);
  int l, li, remaining;
  unsigned char *d, *s;

  remaining = length;
  while (remaining > 0) {
    l = remaining;
    if (dstoffs > srcoffs) {
      if (l > lzss_size(&rar->lzss) - dstoffs)
        l = lzss_size(&rar->lzss) - dstoffs;
    } else {
      if (l > lzss_size(&rar->lzss) - srcoffs)
        l = lzss_size(&rar->lzss) - srcoffs;
    }
    d = &(rar->lzss.window[dstoffs]);
    s = &(rar->lzss.window[srcoffs]);
    if ((dstoffs + l < srcoffs) || (srcoffs + l < dstoffs))
      memcpy(d, s, l);
    else {
      for (li = 0; li < l; li++)
        d[li] = s[li];
    }
    remaining -= l;
    dstoffs = (dstoffs + l) & lzss_mask(&(rar->lzss));
    srcoffs = (srcoffs + l) & lzss_mask(&(rar->lzss));
  }
  rar->lzss.position += length;
}